

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

namespace_t * __thiscall
cs_impl::any::holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_>::get_ext
          (holder<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>_> *this)

{
  namespace_t *pnVar1;
  
  pnVar1 = get_ext<std::shared_ptr<cs_impl::runtime_cs_ext::fiber_holder_impl>>();
  return pnVar1;
}

Assistant:

virtual cs::namespace_t &get_ext() const override
			{
				return cs_impl::get_ext<T>();
			}